

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O2

void pstack::
     print_container<std::vector<pstack::Dwarf::LineState,std::allocator<pstack::Dwarf::LineState>>,char_const&>
               (ostream *os,long *container,char *ctx)

{
  LineState *pLVar1;
  ostream *os_00;
  char *pcVar2;
  LineState *field;
  LineState *pLVar3;
  JSON<pstack::Dwarf::LineState,_char> local_40;
  
  std::operator<<(os,"[ ");
  pLVar1 = (LineState *)container[1];
  pcVar2 = "";
  for (pLVar3 = (LineState *)*container; pLVar3 != pLVar1; pLVar3 = pLVar3 + 1) {
    os_00 = std::operator<<(os,pcVar2);
    local_40.object = pLVar3;
    local_40.context = ctx;
    operator<<(os_00,&local_40);
    pcVar2 = ",\n";
  }
  std::operator<<(os," ]");
  return;
}

Assistant:

void print_container(std::ostream &os, const Container &container, Context &&ctx, std::false_type)
{
   os << "[ ";
   const char *sep = "";
   for (const auto &field : container) {
      os << sep << json(field, ctx);
      sep = ",\n";
   }
   os << " ]";
}